

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::RenderArrow(ImDrawList *draw_list,ImVec2 pos,ImU32 col,ImGuiDir dir,float scale)

{
  ImVec2 local_d0;
  ImVec2 local_c8;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 local_a8;
  ImVec2 local_a0;
  ImVec2 local_98;
  ImVec2 local_90;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  ImVec2 local_70;
  ImVec2 local_68;
  ImVec2 local_60;
  ImVec2 local_58;
  ImVec2 c;
  ImVec2 b;
  ImVec2 a;
  ImVec2 local_34;
  ImVec2 center;
  float r;
  float h;
  float scale_local;
  ImGuiDir dir_local;
  ImU32 col_local;
  ImDrawList *draw_list_local;
  ImVec2 pos_local;
  
  center.y = draw_list->_Data->FontSize;
  center.x = center.y * 0.4 * scale;
  draw_list_local = (ImDrawList *)pos;
  ImVec2::ImVec2((ImVec2 *)&a.y,center.y * 0.5,center.y * 0.5 * scale);
  local_34 = operator+((ImVec2 *)&draw_list_local,(ImVec2 *)&a.y);
  ImVec2::ImVec2(&b);
  ImVec2::ImVec2(&c);
  ImVec2::ImVec2(&local_58);
  if (dir == -1) {
LAB_0010eaef:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jdupuy[P]LongestEdgeBisectionDemos/submodules/imgui/imgui.cpp"
                  ,0x967,"void ImGui::RenderArrow(ImDrawList *, ImVec2, ImU32, ImGuiDir, float)");
  }
  if ((uint)dir < 2) {
    if (dir == 0) {
      center.x = -center.x;
    }
    ImVec2::ImVec2(&local_98,0.75,0.0);
    local_90 = ::operator*(&local_98,center.x);
    b = local_90;
    ImVec2::ImVec2(&local_a8,-0.75,0.866);
    local_a0 = ::operator*(&local_a8,center.x);
    c = local_a0;
    ImVec2::ImVec2(&local_b8,-0.75,-0.866);
    local_b0 = ::operator*(&local_b8,center.x);
    local_58 = local_b0;
  }
  else if (dir - 2U < 2) {
    if (dir == 2) {
      center.x = -center.x;
    }
    ImVec2::ImVec2(&local_68,0.0,0.75);
    local_60 = ::operator*(&local_68,center.x);
    b = local_60;
    ImVec2::ImVec2(&local_78,-0.866,-0.75);
    local_70 = ::operator*(&local_78,center.x);
    c = local_70;
    ImVec2::ImVec2(&local_88,0.866,-0.75);
    local_80 = ::operator*(&local_88,center.x);
    local_58 = local_80;
  }
  else if (dir == 4) goto LAB_0010eaef;
  local_c0 = operator+(&local_34,&b);
  local_c8 = operator+(&local_34,&c);
  local_d0 = operator+(&local_34,&local_58);
  ImDrawList::AddTriangleFilled(draw_list,&local_c0,&local_c8,&local_d0,col);
  return;
}

Assistant:

void ImGui::RenderArrow(ImDrawList* draw_list, ImVec2 pos, ImU32 col, ImGuiDir dir, float scale)
{
    const float h = draw_list->_Data->FontSize * 1.00f;
    float r = h * 0.40f * scale;
    ImVec2 center = pos + ImVec2(h * 0.50f, h * 0.50f * scale);

    ImVec2 a, b, c;
    switch (dir)
    {
    case ImGuiDir_Up:
    case ImGuiDir_Down:
        if (dir == ImGuiDir_Up) r = -r;
        a = ImVec2(+0.000f,+0.750f) * r;
        b = ImVec2(-0.866f,-0.750f) * r;
        c = ImVec2(+0.866f,-0.750f) * r;
        break;
    case ImGuiDir_Left:
    case ImGuiDir_Right:
        if (dir == ImGuiDir_Left) r = -r;
        a = ImVec2(+0.750f,+0.000f) * r;
        b = ImVec2(-0.750f,+0.866f) * r;
        c = ImVec2(-0.750f,-0.866f) * r;
        break;
    case ImGuiDir_None:
    case ImGuiDir_COUNT:
        IM_ASSERT(0);
        break;
    }
    draw_list->AddTriangleFilled(center + a, center + b, center + c, col);
}